

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcCore.c
# Opt level: O3

void Bdc_ManDecPrintSimple(Bdc_Man_t *p)

{
  Bdc_Fun_t *pBVar1;
  ulong uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  puts(" 0 : Const 1");
  if (1 < p->nNodes) {
    uVar6 = 1;
    lVar5 = 0x48;
    do {
      printf(" %d : ",uVar6 & 0xffffffff);
      pBVar1 = p->pNodes;
      if (*(int *)((long)pBVar1 + lVar5 + -0x10) == 2) {
        printf("PI   ");
      }
      else {
        uVar2 = *(ulong *)((long)pBVar1 + lVar5 + -8);
        pcVar4 = "-";
        pcVar3 = "-";
        if ((uVar2 & 1) == 0) {
          pcVar3 = "";
        }
        printf("%s%d &",pcVar3,
               (ulong)(uint)((int)((uVar2 & 0x7fffffffe) - (long)pBVar1 >> 3) * -0x49249249));
        uVar2 = *(ulong *)((long)&pBVar1->Type + lVar5);
        if ((uVar2 & 1) == 0) {
          pcVar4 = "";
        }
        printf(" %s%d   ",pcVar4,
               (ulong)(uint)((int)((uVar2 & 0x7fffffffe) - (long)p->pNodes >> 3) * -0x49249249));
      }
      putchar(10);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x38;
    } while ((long)uVar6 < (long)p->nNodes);
  }
  pcVar3 = "-";
  if (((ulong)p->pRoot & 1) == 0) {
    pcVar3 = "";
  }
  printf("Root = %s%d.\n",pcVar3,
         (ulong)(uint)((int)(((ulong)p->pRoot & 0x7fffffffe) - (long)p->pNodes >> 3) * -0x49249249))
  ;
  return;
}

Assistant:

void Bdc_ManDecPrintSimple( Bdc_Man_t * p )
{
    Bdc_Fun_t * pNode;
    int i;
    printf( " 0 : Const 1\n" );
    for ( i = 1; i < p->nNodes; i++ )
    {
        printf( " %d : ", i );
        pNode = p->pNodes + i;
        if ( pNode->Type == BDC_TYPE_PI )
            printf( "PI   " );
        else
        {
            printf( "%s%d &", Bdc_IsComplement(pNode->pFan0)? "-":"", Bdc_FunId(p,Bdc_Regular(pNode->pFan0)) );
            printf( " %s%d   ", Bdc_IsComplement(pNode->pFan1)? "-":"", Bdc_FunId(p,Bdc_Regular(pNode->pFan1)) );
        }
//        Extra_PrintBinary( stdout, pNode->puFunc, (1<<p->nVars) );
        printf( "\n" );
    }
    printf( "Root = %s%d.\n", Bdc_IsComplement(p->pRoot)? "-":"", Bdc_FunId(p,Bdc_Regular(p->pRoot)) );
}